

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlnode.cpp
# Opt level: O0

void __thiscall
libcellml::XmlNode::setAttribute(XmlNode *this,char *attributeName,char *attributeValue)

{
  bool bVar1;
  xmlNsPtr pxVar2;
  xmlNsPtr ns;
  char *attributeValue_local;
  char *attributeName_local;
  XmlNode *this_local;
  
  bVar1 = hasAttribute(this,attributeName);
  if (bVar1) {
    pxVar2 = getAttributeNamespace(&this->mPimpl->mXmlNodePtr,attributeName);
    xmlSetNsProp(this->mPimpl->mXmlNodePtr,pxVar2,attributeName,attributeValue);
  }
  return;
}

Assistant:

void XmlNode::setAttribute(const char *attributeName, const char *attributeValue)
{
    if (hasAttribute(attributeName)) {
        auto ns = getAttributeNamespace(mPimpl->mXmlNodePtr, attributeName);
        xmlSetNsProp(mPimpl->mXmlNodePtr, ns, reinterpret_cast<const xmlChar *>(attributeName), reinterpret_cast<const xmlChar *>(attributeValue));
    }
}